

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  void *in_RCX;
  undefined8 in_RDX;
  ulong in_R8;
  AllocateResult AVar1;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  if (in_R8 < 0x20000000) {
    AVar1 = BuilderArena::allocate((BuilderArena *)src,(int)in_R8 + 7U >> 3);
    *(undefined4 *)dst = 0xfffffffd;
    *(int *)(dst + 4) = (int)in_R8 * 8 + 2;
    if (in_R8 != 0) {
      memcpy(AVar1.words,in_RCX,in_R8);
    }
    *(SegmentBuilder **)(dst + 8) = AVar1.segment;
    *(undefined8 *)(dst + 0x10) = in_RDX;
    *(word **)(dst + 0x18) = AVar1.words;
    return (int)dst;
  }
  ::anon_func::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)dst);
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Data::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setDataPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}